

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_table_base.hpp
# Opt level: O0

void __thiscall
squall::TableBase::
defun<void(*)(std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&)>
          (TableBase *this,string *name,
          _func_void_function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
          *f)

{
  HSQUIRRELVM vm;
  function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_40;
  _func_void_function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *local_20;
  _func_void_function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *f_local;
  string *name_local;
  TableBase *this_local;
  
  vm = this->vm_;
  local_20 = f;
  f_local = (_func_void_function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
             *)name;
  name_local = (string *)this;
  to_function<void(*)(std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&)>
            (&local_40,(squall *)f,f);
  detail::
  defun_global<void,std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&>
            (vm,&this->tableobj_,name,&local_40);
  std::
  function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_40);
  return;
}

Assistant:

void defun(const string& name, F f) {
        detail::defun_global(vm_, tableobj_, name, to_function(f));
    }